

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O2

Sexp * Evaluate(Sexp *meaning,Sexp *act)

{
  undefined8 uVar1;
  int local_60 [2];
  Kind KStack_58;
  undefined4 uStack_54;
  anon_union_8_2_75fd101e_for_Trampoline_2 local_50;
  int iStack_48;
  Trampoline result;
  FrameProtector local_28;
  FrameProtector __frame_prot;
  
  FrameProtector::FrameProtector(&local_28,"Evaluate");
  iStack_48 = 1;
  result._0_8_ = act;
  result.field_1.value = meaning;
  FrameProtector::ProtectValue(&local_28,(Sexp **)&result,"result.value");
  FrameProtector::ProtectValue(&local_28,&result.field_1.value,"result.meaning");
  while( true ) {
    uVar1 = result._0_8_;
    if (iStack_48 != 1) {
      FrameProtector::~FrameProtector(&local_28);
      return (Sexp *)uVar1;
    }
    if (*(int *)result._0_8_ != 7) break;
    if ((result.field_1.value)->kind != MEANING) {
      __assert_fail("result.meaning->IsMeaning()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.cpp"
                    ,0x114,"Sexp *Evaluate(Sexp *, Sexp *)");
    }
    (**(code **)(((result.field_1.value)->field_1).activation)->parent)
              (local_60,((result.field_1.value)->field_1).activation,result._0_8_);
    result.field_1 = local_50;
    iStack_48 = local_60[0];
    result._4_4_ = uStack_54;
    result.kind = KStack_58;
  }
  __assert_fail("result.activation->IsActivation()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.cpp"
                ,0x113,"Sexp *Evaluate(Sexp *, Sexp *)");
}

Assistant:

Sexp *Evaluate(Sexp *meaning, Sexp *act) {
  GC_HELPER_FRAME;

  Trampoline result(act, meaning);

  // important - the activation and value fields in Trampoline
  // have the same memory location, so only one GC_PROTECT
  // is required.
  GC_PROTECT(result.value);
  GC_PROTECT(result.meaning);

  while (result.IsThunk()) {
    assert(result.activation->IsActivation());
    assert(result.meaning->IsMeaning());
    result = result.meaning->meaning->Eval(result.activation);
  }

  return result.value;
}